

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O0

string * __thiscall
VulkanHppGenerator::generateRAIIHandleConstructorArgument_abi_cxx11_
          (string *__return_storage_ptr__,VulkanHppGenerator *this,ParamData *param,bool definition,
          bool singular,bool takesOwnership)

{
  bool bVar1;
  char *__rhs;
  allocator<char> local_4c1;
  string local_4c0;
  allocator<char> local_499;
  string local_498;
  string local_478;
  string local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  allocator<char> local_411;
  string local_410;
  allocator<char> local_3e9;
  string local_3e8;
  string local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  allocator<char> local_321;
  string local_320;
  string local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  string local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  undefined1 local_c0 [8];
  string argumentType;
  allocator<char> local_89;
  string local_88;
  string local_68;
  undefined1 local_48 [8];
  string argumentName;
  bool takesOwnership_local;
  bool singular_local;
  bool definition_local;
  ParamData *param_local;
  VulkanHppGenerator *this_local;
  string *argument;
  
  argumentName.field_2._M_local_buf[0xc] = '\0';
  argumentName.field_2._M_local_buf[0xd] = takesOwnership;
  argumentName.field_2._M_local_buf[0xe] = singular;
  argumentName.field_2._M_local_buf[0xf] = definition;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  bVar1 = TypeInfo::isConstPointer(&param->type);
  if (bVar1) {
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            starts_with(&(param->type).type,"Vk");
    if (!bVar1) {
      __assert_fail("param.type.type.starts_with( \"Vk\" )",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                    ,0x253f,
                    "std::string VulkanHppGenerator::generateRAIIHandleConstructorArgument(const ParamData &, bool, bool, bool) const"
                   );
    }
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            starts_with(&param->name,"p");
    if (!bVar1) {
      __assert_fail("param.name.starts_with( \"p\" )",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                    ,0x2540,
                    "std::string VulkanHppGenerator::generateRAIIHandleConstructorArgument(const ParamData &, bool, bool, bool) const"
                   );
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"p",&local_89);
    stripPrefix(&local_68,&param->name,&local_88);
    anon_unknown.dwarf_b1723::startLowerCase((string *)local_48,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator(&local_89);
    anon_unknown.dwarf_b1723::generateNamespacedType((string *)local_c0,&(param->type).type);
    if ((param->optional & 1U) == 0) {
      bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        (&param->lenExpression);
      if (bVar1) {
        std::operator+(&local_180,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0
                       ," const & ");
        std::operator+(&local_160,&local_180,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48
                      );
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (__return_storage_ptr__,&local_160);
        std::__cxx11::string::~string((string *)&local_160);
        std::__cxx11::string::~string((string *)&local_180);
      }
      else if ((argumentName.field_2._M_local_buf[0xe] & 1U) == 0) {
        std::operator+(&local_240,"VULKAN_HPP_NAMESPACE::ArrayProxy<",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0
                      );
        std::operator+(&local_220,&local_240,"> const & ");
        std::operator+(&local_200,&local_220,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48
                      );
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (__return_storage_ptr__,&local_200);
        std::__cxx11::string::~string((string *)&local_200);
        std::__cxx11::string::~string((string *)&local_220);
        std::__cxx11::string::~string((string *)&local_240);
      }
      else {
        std::operator+(&local_1c0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0
                       ," const & ");
        stripPluralS(&local_1e0,this,(string *)local_48);
        std::operator+(&local_1a0,&local_1c0,&local_1e0);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (__return_storage_ptr__,&local_1a0);
        std::__cxx11::string::~string((string *)&local_1a0);
        std::__cxx11::string::~string((string *)&local_1e0);
        std::__cxx11::string::~string((string *)&local_1c0);
      }
    }
    else {
      bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        (&param->lenExpression);
      if (!bVar1) {
        __assert_fail("param.lenExpression.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                      ,0x2545,
                      "std::string VulkanHppGenerator::generateRAIIHandleConstructorArgument(const ParamData &, bool, bool, bool) const"
                     );
      }
      std::operator+(&local_140,"VULKAN_HPP_NAMESPACE::Optional<const ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0);
      std::operator+(&local_120,&local_140,"> ");
      std::operator+(&local_100,&local_120,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
      __rhs = " = nullptr";
      if ((argumentName.field_2._M_local_buf[0xf] & 1U) != 0) {
        __rhs = "";
      }
      std::operator+(&local_e0,&local_100,__rhs);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (__return_storage_ptr__,&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_140);
    }
    std::__cxx11::string::~string((string *)local_c0);
    std::__cxx11::string::~string((string *)local_48);
  }
  else {
    bVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::contains(&specialPointerTypes_abi_cxx11_,&(param->type).type);
    if (bVar1) {
      if (((param->optional ^ 0xffU) & 1) == 0) {
        __assert_fail("!param.optional",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                      ,0x2557,
                      "std::string VulkanHppGenerator::generateRAIIHandleConstructorArgument(const ParamData &, bool, bool, bool) const"
                     );
      }
      bVar1 = TypeInfo::isNonConstPointer(&param->type);
      if (!bVar1) {
        __assert_fail("param.type.isNonConstPointer()",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                      ,0x2558,
                      "std::string VulkanHppGenerator::generateRAIIHandleConstructorArgument(const ParamData &, bool, bool, bool) const"
                     );
      }
      std::operator+(&local_280,&(param->type).type," & ");
      std::operator+(&local_260,&local_280,&param->name);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (__return_storage_ptr__,&local_260);
      std::__cxx11::string::~string((string *)&local_260);
      std::__cxx11::string::~string((string *)&local_280);
    }
    else {
      bVar1 = TypeInfo::isValue(&param->type);
      if ((bVar1) && (bVar1 = isHandleType(this,&(param->type).type), bVar1)) {
        if ((argumentName.field_2._M_local_buf[0xd] & 1U) == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_320,"Vk",&local_321);
          stripPrefix(&local_300,&(param->type).type,&local_320);
          std::operator+(&local_2e0,"VULKAN_HPP_NAMESPACE::VULKAN_HPP_RAII_NAMESPACE::",&local_300);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (__return_storage_ptr__,&local_2e0);
          std::__cxx11::string::~string((string *)&local_2e0);
          std::__cxx11::string::~string((string *)&local_300);
          std::__cxx11::string::~string((string *)&local_320);
          std::allocator<char>::~allocator(&local_321);
          if ((param->optional & 1U) != 0) {
            std::operator+(&local_368,"VULKAN_HPP_NAMESPACE::Optional<const ",__return_storage_ptr__
                          );
            std::operator+(&local_348,&local_368,">");
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(__return_storage_ptr__,&local_348);
            std::__cxx11::string::~string((string *)&local_348);
            std::__cxx11::string::~string((string *)&local_368);
          }
          std::operator+(&local_388," const & ",&param->name);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=(__return_storage_ptr__,&local_388);
          std::__cxx11::string::~string((string *)&local_388);
        }
        else {
          if (((param->optional ^ 0xffU) & 1) == 0) {
            __assert_fail("!param.optional",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                          ,0x255f,
                          "std::string VulkanHppGenerator::generateRAIIHandleConstructorArgument(const ParamData &, bool, bool, bool) const"
                         );
          }
          std::operator+(&local_2c0,&(param->type).type," ");
          std::operator+(&local_2a0,&local_2c0,&param->name);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (__return_storage_ptr__,&local_2a0);
          std::__cxx11::string::~string((string *)&local_2a0);
          std::__cxx11::string::~string((string *)&local_2c0);
        }
      }
      else {
        if (((param->optional ^ 0xffU) & 1) == 0) {
          __assert_fail("!param.optional",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                        ,0x256e,
                        "std::string VulkanHppGenerator::generateRAIIHandleConstructorArgument(const ParamData &, bool, bool, bool) const"
                       );
        }
        bVar1 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty(&param->arraySizes);
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3e8,"VULKAN_HPP_NAMESPACE",&local_3e9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_410,"Vk",&local_411);
          TypeInfo::compose(&local_3c8,&param->type,&local_3e8,&local_410);
          std::operator+(&local_3a8,&local_3c8," ");
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (__return_storage_ptr__,&local_3a8);
          std::__cxx11::string::~string((string *)&local_3a8);
          std::__cxx11::string::~string((string *)&local_3c8);
          std::__cxx11::string::~string((string *)&local_410);
          std::allocator<char>::~allocator(&local_411);
          std::__cxx11::string::~string((string *)&local_3e8);
          std::allocator<char>::~allocator(&local_3e9);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_498,"VULKAN_HPP_NAMESPACE",&local_499);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_4c0,"Vk",&local_4c1);
          TypeInfo::compose(&local_478,&param->type,&local_498,&local_4c0);
          anon_unknown.dwarf_b1723::generateStandardArray(&local_458,&local_478,&param->arraySizes);
          std::operator+(&local_438,&local_458," const & ");
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (__return_storage_ptr__,&local_438);
          std::__cxx11::string::~string((string *)&local_438);
          std::__cxx11::string::~string((string *)&local_458);
          std::__cxx11::string::~string((string *)&local_478);
          std::__cxx11::string::~string((string *)&local_4c0);
          std::allocator<char>::~allocator(&local_4c1);
          std::__cxx11::string::~string((string *)&local_498);
          std::allocator<char>::~allocator(&local_499);
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  (__return_storage_ptr__,&param->name);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateRAIIHandleConstructorArgument( ParamData const & param, bool definition, bool singular, bool takesOwnership ) const
{
  std::string argument;
  if ( param.type.isConstPointer() )
  {
    assert( param.type.type.starts_with( "Vk" ) );
    assert( param.name.starts_with( "p" ) );
    std::string argumentName = startLowerCase( stripPrefix( param.name, "p" ) );
    std::string argumentType = generateNamespacedType( param.type.type );
    if ( param.optional )
    {
      assert( param.lenExpression.empty() );
      argument = "VULKAN_HPP_NAMESPACE::Optional<const " + argumentType + "> " + argumentName + ( definition ? "" : " = nullptr" );
    }
    else if ( param.lenExpression.empty() )
    {
      argument = argumentType + " const & " + argumentName;
    }
    else if ( singular )
    {
      argument = argumentType + " const & " + stripPluralS( argumentName );
    }
    else
    {
      argument = "VULKAN_HPP_NAMESPACE::ArrayProxy<" + argumentType + "> const & " + argumentName;
    }
  }
  else if ( specialPointerTypes.contains( param.type.type ) )
  {
    assert( !param.optional );
    assert( param.type.isNonConstPointer() );
    argument = param.type.type + " & " + param.name;
  }
  else if ( ( param.type.isValue() ) && isHandleType( param.type.type ) )
  {
    if ( takesOwnership )
    {
      assert( !param.optional );
      argument = param.type.type + " " + param.name;
    }
    else
    {
      argument = "VULKAN_HPP_NAMESPACE::VULKAN_HPP_RAII_NAMESPACE::" + stripPrefix( param.type.type, "Vk" );
      if ( param.optional )
      {
        argument = "VULKAN_HPP_NAMESPACE::Optional<const " + argument + ">";
      }
      argument += " const & " + param.name;
    }
  }
  else
  {
    assert( !param.optional );
    if ( param.arraySizes.empty() )
    {
      argument = param.type.compose( "VULKAN_HPP_NAMESPACE" ) + " ";
    }
    else
    {
      argument = generateStandardArray( param.type.compose( "VULKAN_HPP_NAMESPACE" ), param.arraySizes ) + " const & ";
    }
    argument += param.name;
  }
  return argument;
}